

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_16,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::ObjectIntersectorK<16,_true>_>,_false>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [64];
  AABBNodeMB4D *node1;
  ulong uVar23;
  RTCIntersectFunctionN p_Var24;
  ushort uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [64];
  ulong *puVar31;
  bool bVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  int iVar71;
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 in_ZMM2 [64];
  vint<16> mask;
  NodeRef stack_node [241];
  vfloat<16> stack_near [241];
  uint local_4734;
  RTCIntersectFunctionNArguments local_4708;
  Geometry *local_46d8;
  undefined8 local_46d0;
  RTCIntersectArguments *local_46c8;
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined8 local_4450;
  ulong local_4448 [241];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [15376];
  undefined1 auVar38 [64];
  
  uVar28 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar28 != 8) {
    auVar36 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    uVar33 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),ZEXT1664(ZEXT816(0) << 0x40),5);
    uVar23 = vpcmpeqd_avx512f(auVar36,(undefined1  [64])valid_i->field_0);
    uVar33 = uVar33 & uVar23;
    if ((ushort)uVar33 != 0) {
      auVar36 = *(undefined1 (*) [64])(ray + 0x100);
      auVar45 = *(undefined1 (*) [64])(ray + 0x140);
      auVar46 = *(undefined1 (*) [64])(ray + 0x180);
      auVar37 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      auVar38 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),ZEXT1664(ZEXT816(0) << 0x40));
      bVar32 = (bool)((byte)uVar33 & 1);
      auVar39._0_4_ = (uint)bVar32 * auVar38._0_4_ | (uint)!bVar32 * auVar37._0_4_;
      bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar32 * auVar38._4_4_ | (uint)!bVar32 * auVar37._4_4_;
      bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar32 * auVar38._8_4_ | (uint)!bVar32 * auVar37._8_4_;
      bVar32 = (bool)((byte)(uVar33 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar32 * auVar38._12_4_ | (uint)!bVar32 * auVar37._12_4_;
      bVar32 = (bool)((byte)(uVar33 >> 4) & 1);
      auVar39._16_4_ = (uint)bVar32 * auVar38._16_4_ | (uint)!bVar32 * auVar37._16_4_;
      bVar32 = (bool)((byte)(uVar33 >> 5) & 1);
      auVar39._20_4_ = (uint)bVar32 * auVar38._20_4_ | (uint)!bVar32 * auVar37._20_4_;
      bVar32 = (bool)((byte)(uVar33 >> 6) & 1);
      auVar39._24_4_ = (uint)bVar32 * auVar38._24_4_ | (uint)!bVar32 * auVar37._24_4_;
      bVar32 = (bool)((byte)(uVar33 >> 7) & 1);
      auVar39._28_4_ = (uint)bVar32 * auVar38._28_4_ | (uint)!bVar32 * auVar37._28_4_;
      bVar10 = (byte)(uVar33 >> 8);
      bVar32 = (bool)(bVar10 & 1);
      auVar39._32_4_ = (uint)bVar32 * auVar38._32_4_ | (uint)!bVar32 * auVar37._32_4_;
      bVar32 = (bool)((byte)(uVar33 >> 9) & 1);
      auVar39._36_4_ = (uint)bVar32 * auVar38._36_4_ | (uint)!bVar32 * auVar37._36_4_;
      bVar32 = (bool)((byte)(uVar33 >> 10) & 1);
      auVar39._40_4_ = (uint)bVar32 * auVar38._40_4_ | (uint)!bVar32 * auVar37._40_4_;
      bVar32 = (bool)((byte)(uVar33 >> 0xb) & 1);
      auVar39._44_4_ = (uint)bVar32 * auVar38._44_4_ | (uint)!bVar32 * auVar37._44_4_;
      bVar32 = (bool)((byte)(uVar33 >> 0xc) & 1);
      auVar39._48_4_ = (uint)bVar32 * auVar38._48_4_ | (uint)!bVar32 * auVar37._48_4_;
      bVar32 = (bool)((byte)(uVar33 >> 0xd) & 1);
      auVar39._52_4_ = (uint)bVar32 * auVar38._52_4_ | (uint)!bVar32 * auVar37._52_4_;
      bVar32 = (bool)((byte)(uVar33 >> 0xe) & 1);
      auVar39._56_4_ = (uint)bVar32 * auVar38._56_4_ | (uint)!bVar32 * auVar37._56_4_;
      bVar32 = SUB81(uVar33 >> 0xf,0);
      auVar39._60_4_ = (uint)bVar32 * auVar38._60_4_ | (uint)!bVar32 * auVar37._60_4_;
      auVar38 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar40 = vxorps_avx512dq(auVar38,*(undefined1 (*) [64])ray);
      local_4734 = (uint)(ushort)~(ushort)uVar33;
      auVar41 = vxorps_avx512dq(auVar38,*(undefined1 (*) [64])(ray + 0x40));
      auVar38 = vxorps_avx512dq(auVar38,*(undefined1 (*) [64])(ray + 0x80));
      local_4450 = 0xfffffffffffffff8;
      local_4448[0] = uVar28;
      local_3c80 = auVar39;
      if (uVar28 != 0xfffffffffffffff8) {
        auVar42 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
        auVar43 = vandps_avx512dq(auVar36,auVar42);
        auVar44 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
        uVar23 = vcmpps_avx512f(auVar43,auVar44,1);
        bVar32 = (bool)((byte)uVar23 & 1);
        iVar35 = auVar44._0_4_;
        auVar43._0_4_ = (uint)bVar32 * iVar35 | (uint)!bVar32 * auVar36._0_4_;
        bVar32 = (bool)((byte)(uVar23 >> 1) & 1);
        iVar57 = auVar44._4_4_;
        auVar43._4_4_ = (uint)bVar32 * iVar57 | (uint)!bVar32 * auVar36._4_4_;
        bVar32 = (bool)((byte)(uVar23 >> 2) & 1);
        iVar58 = auVar44._8_4_;
        auVar43._8_4_ = (uint)bVar32 * iVar58 | (uint)!bVar32 * auVar36._8_4_;
        bVar32 = (bool)((byte)(uVar23 >> 3) & 1);
        iVar59 = auVar44._12_4_;
        auVar43._12_4_ = (uint)bVar32 * iVar59 | (uint)!bVar32 * auVar36._12_4_;
        bVar32 = (bool)((byte)(uVar23 >> 4) & 1);
        iVar60 = auVar44._16_4_;
        auVar43._16_4_ = (uint)bVar32 * iVar60 | (uint)!bVar32 * auVar36._16_4_;
        bVar32 = (bool)((byte)(uVar23 >> 5) & 1);
        iVar61 = auVar44._20_4_;
        auVar43._20_4_ = (uint)bVar32 * iVar61 | (uint)!bVar32 * auVar36._20_4_;
        bVar32 = (bool)((byte)(uVar23 >> 6) & 1);
        iVar62 = auVar44._24_4_;
        auVar43._24_4_ = (uint)bVar32 * iVar62 | (uint)!bVar32 * auVar36._24_4_;
        bVar32 = (bool)((byte)(uVar23 >> 7) & 1);
        iVar63 = auVar44._28_4_;
        auVar43._28_4_ = (uint)bVar32 * iVar63 | (uint)!bVar32 * auVar36._28_4_;
        bVar32 = (bool)((byte)(uVar23 >> 8) & 1);
        iVar64 = auVar44._32_4_;
        auVar43._32_4_ = (uint)bVar32 * iVar64 | (uint)!bVar32 * auVar36._32_4_;
        bVar32 = (bool)((byte)(uVar23 >> 9) & 1);
        iVar65 = auVar44._36_4_;
        auVar43._36_4_ = (uint)bVar32 * iVar65 | (uint)!bVar32 * auVar36._36_4_;
        bVar32 = (bool)((byte)(uVar23 >> 10) & 1);
        iVar66 = auVar44._40_4_;
        auVar43._40_4_ = (uint)bVar32 * iVar66 | (uint)!bVar32 * auVar36._40_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xb) & 1);
        iVar67 = auVar44._44_4_;
        auVar43._44_4_ = (uint)bVar32 * iVar67 | (uint)!bVar32 * auVar36._44_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xc) & 1);
        iVar68 = auVar44._48_4_;
        auVar43._48_4_ = (uint)bVar32 * iVar68 | (uint)!bVar32 * auVar36._48_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xd) & 1);
        iVar69 = auVar44._52_4_;
        auVar43._52_4_ = (uint)bVar32 * iVar69 | (uint)!bVar32 * auVar36._52_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xe) & 1);
        iVar70 = auVar44._56_4_;
        iVar71 = auVar44._60_4_;
        auVar43._56_4_ = (uint)bVar32 * iVar70 | (uint)!bVar32 * auVar36._56_4_;
        bVar32 = SUB81(uVar23 >> 0xf,0);
        auVar43._60_4_ = (uint)bVar32 * iVar71 | (uint)!bVar32 * auVar36._60_4_;
        auVar36 = vandps_avx512dq(auVar45,auVar42);
        uVar23 = vcmpps_avx512f(auVar36,auVar44,1);
        bVar32 = (bool)((byte)uVar23 & 1);
        auVar36._0_4_ = (uint)bVar32 * iVar35 | (uint)!bVar32 * auVar45._0_4_;
        bVar32 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar32 * iVar57 | (uint)!bVar32 * auVar45._4_4_;
        bVar32 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar32 * iVar58 | (uint)!bVar32 * auVar45._8_4_;
        bVar32 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar32 * iVar59 | (uint)!bVar32 * auVar45._12_4_;
        bVar32 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar36._16_4_ = (uint)bVar32 * iVar60 | (uint)!bVar32 * auVar45._16_4_;
        bVar32 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar36._20_4_ = (uint)bVar32 * iVar61 | (uint)!bVar32 * auVar45._20_4_;
        bVar32 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar36._24_4_ = (uint)bVar32 * iVar62 | (uint)!bVar32 * auVar45._24_4_;
        bVar32 = (bool)((byte)(uVar23 >> 7) & 1);
        auVar36._28_4_ = (uint)bVar32 * iVar63 | (uint)!bVar32 * auVar45._28_4_;
        bVar32 = (bool)((byte)(uVar23 >> 8) & 1);
        auVar36._32_4_ = (uint)bVar32 * iVar64 | (uint)!bVar32 * auVar45._32_4_;
        bVar32 = (bool)((byte)(uVar23 >> 9) & 1);
        auVar36._36_4_ = (uint)bVar32 * iVar65 | (uint)!bVar32 * auVar45._36_4_;
        bVar32 = (bool)((byte)(uVar23 >> 10) & 1);
        auVar36._40_4_ = (uint)bVar32 * iVar66 | (uint)!bVar32 * auVar45._40_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xb) & 1);
        auVar36._44_4_ = (uint)bVar32 * iVar67 | (uint)!bVar32 * auVar45._44_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xc) & 1);
        auVar36._48_4_ = (uint)bVar32 * iVar68 | (uint)!bVar32 * auVar45._48_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xd) & 1);
        auVar36._52_4_ = (uint)bVar32 * iVar69 | (uint)!bVar32 * auVar45._52_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xe) & 1);
        auVar36._56_4_ = (uint)bVar32 * iVar70 | (uint)!bVar32 * auVar45._56_4_;
        bVar32 = SUB81(uVar23 >> 0xf,0);
        auVar36._60_4_ = (uint)bVar32 * iVar71 | (uint)!bVar32 * auVar45._60_4_;
        auVar45 = vandps_avx512dq(auVar46,auVar42);
        auVar42 = vrcp14ps_avx512f(auVar43);
        uVar23 = vcmpps_avx512f(auVar45,auVar44,1);
        auVar45 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar44 = vrcp14ps_avx512f(auVar36);
        bVar32 = (bool)((byte)uVar23 & 1);
        auVar47._0_4_ = (uint)bVar32 * iVar35 | (uint)!bVar32 * auVar46._0_4_;
        bVar32 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar32 * iVar57 | (uint)!bVar32 * auVar46._4_4_;
        bVar32 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar32 * iVar58 | (uint)!bVar32 * auVar46._8_4_;
        bVar32 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar32 * iVar59 | (uint)!bVar32 * auVar46._12_4_;
        bVar32 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar47._16_4_ = (uint)bVar32 * iVar60 | (uint)!bVar32 * auVar46._16_4_;
        bVar32 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar47._20_4_ = (uint)bVar32 * iVar61 | (uint)!bVar32 * auVar46._20_4_;
        bVar32 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar47._24_4_ = (uint)bVar32 * iVar62 | (uint)!bVar32 * auVar46._24_4_;
        bVar32 = (bool)((byte)(uVar23 >> 7) & 1);
        auVar47._28_4_ = (uint)bVar32 * iVar63 | (uint)!bVar32 * auVar46._28_4_;
        bVar32 = (bool)((byte)(uVar23 >> 8) & 1);
        auVar47._32_4_ = (uint)bVar32 * iVar64 | (uint)!bVar32 * auVar46._32_4_;
        bVar32 = (bool)((byte)(uVar23 >> 9) & 1);
        auVar47._36_4_ = (uint)bVar32 * iVar65 | (uint)!bVar32 * auVar46._36_4_;
        bVar32 = (bool)((byte)(uVar23 >> 10) & 1);
        auVar47._40_4_ = (uint)bVar32 * iVar66 | (uint)!bVar32 * auVar46._40_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xb) & 1);
        auVar47._44_4_ = (uint)bVar32 * iVar67 | (uint)!bVar32 * auVar46._44_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xc) & 1);
        auVar47._48_4_ = (uint)bVar32 * iVar68 | (uint)!bVar32 * auVar46._48_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xd) & 1);
        auVar47._52_4_ = (uint)bVar32 * iVar69 | (uint)!bVar32 * auVar46._52_4_;
        bVar32 = (bool)((byte)(uVar23 >> 0xe) & 1);
        auVar47._56_4_ = (uint)bVar32 * iVar70 | (uint)!bVar32 * auVar46._56_4_;
        bVar32 = SUB81(uVar23 >> 0xf,0);
        auVar47._60_4_ = (uint)bVar32 * iVar71 | (uint)!bVar32 * auVar46._60_4_;
        auVar46 = vfnmadd213ps_avx512f(auVar43,auVar42,auVar45);
        auVar36 = vfnmadd213ps_avx512f(auVar36,auVar44,auVar45);
        auVar43 = vrcp14ps_avx512f(auVar47);
        auVar47 = vfnmadd213ps_avx512f(auVar47,auVar43,auVar45);
        auVar45 = vfmadd132ps_avx512f(auVar36,auVar44,auVar44);
        auVar36 = vfmadd132ps_avx512f(auVar46,auVar42,auVar42);
        auVar46 = vfmadd132ps_avx512f(auVar47,auVar43,auVar43);
        puVar31 = local_4448;
        auVar40 = vmulps_avx512f(auVar36,auVar40);
        auVar41 = vmulps_avx512f(auVar45,auVar41);
        auVar38 = vmulps_avx512f(auVar46,auVar38);
        auVar43 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        auVar44 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),ZEXT1664(ZEXT816(0) << 0x40));
        bVar32 = (bool)((byte)uVar33 & 1);
        auVar42._0_4_ = (uint)bVar32 * auVar44._0_4_ | (uint)!bVar32 * auVar43._0_4_;
        bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar32 * auVar44._4_4_ | (uint)!bVar32 * auVar43._4_4_;
        bVar32 = (bool)((byte)(uVar33 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar32 * auVar44._8_4_ | (uint)!bVar32 * auVar43._8_4_;
        bVar32 = (bool)((byte)(uVar33 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar32 * auVar44._12_4_ | (uint)!bVar32 * auVar43._12_4_;
        bVar32 = (bool)((byte)(uVar33 >> 4) & 1);
        auVar42._16_4_ = (uint)bVar32 * auVar44._16_4_ | (uint)!bVar32 * auVar43._16_4_;
        bVar32 = (bool)((byte)(uVar33 >> 5) & 1);
        auVar42._20_4_ = (uint)bVar32 * auVar44._20_4_ | (uint)!bVar32 * auVar43._20_4_;
        bVar32 = (bool)((byte)(uVar33 >> 6) & 1);
        auVar42._24_4_ = (uint)bVar32 * auVar44._24_4_ | (uint)!bVar32 * auVar43._24_4_;
        bVar32 = (bool)((byte)(uVar33 >> 7) & 1);
        auVar42._28_4_ = (uint)bVar32 * auVar44._28_4_ | (uint)!bVar32 * auVar43._28_4_;
        bVar32 = (bool)(bVar10 & 1);
        auVar42._32_4_ = (uint)bVar32 * auVar44._32_4_ | (uint)!bVar32 * auVar43._32_4_;
        bVar32 = (bool)((byte)(uVar33 >> 9) & 1);
        auVar42._36_4_ = (uint)bVar32 * auVar44._36_4_ | (uint)!bVar32 * auVar43._36_4_;
        bVar32 = (bool)((byte)(uVar33 >> 10) & 1);
        auVar42._40_4_ = (uint)bVar32 * auVar44._40_4_ | (uint)!bVar32 * auVar43._40_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xb) & 1);
        auVar42._44_4_ = (uint)bVar32 * auVar44._44_4_ | (uint)!bVar32 * auVar43._44_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xc) & 1);
        auVar42._48_4_ = (uint)bVar32 * auVar44._48_4_ | (uint)!bVar32 * auVar43._48_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xd) & 1);
        auVar42._52_4_ = (uint)bVar32 * auVar44._52_4_ | (uint)!bVar32 * auVar43._52_4_;
        bVar32 = (bool)((byte)(uVar33 >> 0xe) & 1);
        auVar42._56_4_ = (uint)bVar32 * auVar44._56_4_ | (uint)!bVar32 * auVar43._56_4_;
        bVar32 = SUB81(uVar33 >> 0xf,0);
        auVar42._60_4_ = (uint)bVar32 * auVar44._60_4_ | (uint)!bVar32 * auVar43._60_4_;
        pauVar30 = (undefined1 (*) [64])local_3c40;
        local_46c0 = auVar38;
        local_4680 = auVar41;
        local_4640 = auVar40;
        local_4600 = auVar39;
        local_45c0 = auVar46;
        local_4580 = auVar45;
        local_4540 = auVar36;
        local_3cc0 = auVar37;
        do {
          auVar43 = pauVar30[-1];
          pauVar30 = pauVar30 + -1;
          uVar19 = vcmpps_avx512f(auVar43,auVar42,1);
          auVar44 = auVar42;
          if ((short)uVar19 != 0) {
LAB_00887157:
            uVar27 = (uint)uVar28;
            if ((uVar28 & 8) == 0) goto code_r0x00887161;
            if (uVar28 == 0xfffffffffffffff8) break;
            uVar19 = vcmpps_avx512f(auVar42,auVar43,6);
            if ((short)uVar19 != 0) {
              uVar23 = (ulong)(uVar27 & 0xf);
              uVar27 = local_4734;
              if (uVar23 != 8) {
                uVar27 = ~local_4734;
                uVar29 = 1;
                local_4500 = auVar42;
                do {
                  local_4708.geomID = *(uint *)(((uVar28 & 0xfffffffffffffff0) - 8) + uVar29 * 8);
                  local_46d8 = (context->scene->geometries).items[local_4708.geomID].ptr;
                  auVar43 = vpbroadcastd_avx512f(ZEXT416(local_46d8->mask));
                  uVar19 = vptestmd_avx512f(auVar43,*(undefined1 (*) [64])(ray + 0x240));
                  uVar25 = (ushort)uVar19 & (ushort)uVar27;
                  if (uVar25 == 0) {
                    uVar25 = 0xffff;
                  }
                  else {
                    local_4708.primID = *(uint *)(((uVar28 & 0xfffffffffffffff0) - 4) + uVar29 * 8);
                    auVar36 = vpmovm2d_avx512dq((ulong)uVar25);
                    local_44c0 = vmovdqa64_avx512f(auVar36);
                    local_4708.valid = (int *)local_44c0;
                    local_4708.geometryUserPtr = local_46d8->userPtr;
                    local_4708.context = context->user;
                    local_4708.N = 0x10;
                    local_46d0 = 0;
                    local_46c8 = context->args;
                    p_Var24 = local_46c8->intersect;
                    if (p_Var24 == (RTCIntersectFunctionN)0x0) {
                      p_Var24 = (RTCIntersectFunctionN)
                                local_46d8[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i;
                    }
                    local_4708.rayhit = (RTCRayHitN *)ray;
                    (*p_Var24)(&local_4708);
                    uVar19 = vcmpps_avx512f(ZEXT1664((undefined1  [16])0x0),
                                            *(undefined1 (*) [64])(ray + 0x200),10);
                    uVar25 = (ushort)uVar19;
                    auVar37 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                    auVar36 = local_4540;
                    auVar45 = local_4580;
                    auVar46 = local_45c0;
                    auVar39 = local_4600;
                    auVar40 = local_4640;
                    auVar41 = local_4680;
                    auVar38 = local_46c0;
                    auVar42 = local_4500;
                  }
                  uVar25 = (ushort)uVar27 & uVar25;
                  uVar27 = (uint)uVar25;
                } while ((uVar25 != 0) &&
                        (bVar32 = uVar29 < uVar23 - 8, uVar29 = uVar29 + 1, bVar32));
                uVar27 = ~(uint)uVar25;
              }
              local_4734 = local_4734 | uVar27;
              if ((short)local_4734 != -1) {
                auVar43 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar32 = (bool)((byte)local_4734 & 1);
                auVar44._0_4_ = (uint)bVar32 * auVar43._0_4_ | (uint)!bVar32 * auVar42._0_4_;
                bVar32 = (bool)((byte)(local_4734 >> 1) & 1);
                auVar44._4_4_ = (uint)bVar32 * auVar43._4_4_ | (uint)!bVar32 * auVar42._4_4_;
                bVar32 = (bool)((byte)(local_4734 >> 2) & 1);
                auVar44._8_4_ = (uint)bVar32 * auVar43._8_4_ | (uint)!bVar32 * auVar42._8_4_;
                bVar32 = (bool)((byte)(local_4734 >> 3) & 1);
                auVar44._12_4_ = (uint)bVar32 * auVar43._12_4_ | (uint)!bVar32 * auVar42._12_4_;
                bVar32 = (bool)((byte)(local_4734 >> 4) & 1);
                auVar44._16_4_ = (uint)bVar32 * auVar43._16_4_ | (uint)!bVar32 * auVar42._16_4_;
                bVar32 = (bool)((byte)(local_4734 >> 5) & 1);
                auVar44._20_4_ = (uint)bVar32 * auVar43._20_4_ | (uint)!bVar32 * auVar42._20_4_;
                bVar32 = (bool)((byte)(local_4734 >> 6) & 1);
                auVar44._24_4_ = (uint)bVar32 * auVar43._24_4_ | (uint)!bVar32 * auVar42._24_4_;
                bVar32 = (bool)((byte)(local_4734 >> 7) & 1);
                auVar44._28_4_ = (uint)bVar32 * auVar43._28_4_ | (uint)!bVar32 * auVar42._28_4_;
                bVar32 = (bool)((byte)(local_4734 >> 8) & 1);
                auVar44._32_4_ = (uint)bVar32 * auVar43._32_4_ | (uint)!bVar32 * auVar42._32_4_;
                bVar32 = (bool)((byte)(local_4734 >> 9) & 1);
                auVar44._36_4_ = (uint)bVar32 * auVar43._36_4_ | (uint)!bVar32 * auVar42._36_4_;
                bVar32 = (bool)((byte)(local_4734 >> 10) & 1);
                auVar44._40_4_ = (uint)bVar32 * auVar43._40_4_ | (uint)!bVar32 * auVar42._40_4_;
                bVar32 = (bool)((byte)(local_4734 >> 0xb) & 1);
                auVar44._44_4_ = (uint)bVar32 * auVar43._44_4_ | (uint)!bVar32 * auVar42._44_4_;
                bVar32 = (bool)((byte)(local_4734 >> 0xc) & 1);
                auVar44._48_4_ = (uint)bVar32 * auVar43._48_4_ | (uint)!bVar32 * auVar42._48_4_;
                bVar32 = (bool)((byte)(local_4734 >> 0xd) & 1);
                auVar44._52_4_ = (uint)bVar32 * auVar43._52_4_ | (uint)!bVar32 * auVar42._52_4_;
                bVar32 = (bool)((byte)(local_4734 >> 0xe) & 1);
                auVar44._56_4_ = (uint)bVar32 * auVar43._56_4_ | (uint)!bVar32 * auVar42._56_4_;
                bVar32 = (bool)((byte)(local_4734 >> 0xf) & 1);
                auVar44._60_4_ = (uint)bVar32 * auVar43._60_4_ | (uint)!bVar32 * auVar42._60_4_;
                goto LAB_008872e1;
              }
              local_4734 = 0xffff;
              break;
            }
          }
LAB_008872e1:
          uVar28 = puVar31[-1];
          puVar31 = puVar31 + -1;
          auVar42 = auVar44;
        } while (uVar28 != 0xfffffffffffffff8);
      }
      local_4734 = local_4734 & (uint)uVar33;
      auVar36 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar32 = (bool)((byte)local_4734 & 1);
      bVar3 = (bool)((byte)(local_4734 >> 1) & 1);
      bVar4 = (bool)((byte)(local_4734 >> 2) & 1);
      bVar5 = (bool)((byte)(local_4734 >> 3) & 1);
      bVar6 = (bool)((byte)(local_4734 >> 4) & 1);
      bVar7 = (bool)((byte)(local_4734 >> 5) & 1);
      bVar8 = (bool)((byte)(local_4734 >> 6) & 1);
      bVar9 = (bool)((byte)(local_4734 >> 7) & 1);
      bVar11 = (bool)((byte)(local_4734 >> 8) & 1);
      bVar12 = (bool)((byte)(local_4734 >> 9) & 1);
      bVar13 = (bool)((byte)(local_4734 >> 10) & 1);
      bVar14 = (bool)((byte)(local_4734 >> 0xb) & 1);
      bVar15 = (bool)((byte)(local_4734 >> 0xc) & 1);
      bVar16 = (bool)((byte)(local_4734 >> 0xd) & 1);
      bVar17 = (bool)((byte)(local_4734 >> 0xe) & 1);
      bVar18 = (bool)((byte)(local_4734 >> 0xf) & 1);
      *(uint *)(ray + 0x200) = (uint)bVar32 * auVar36._0_4_ | (uint)!bVar32 * *(int *)(ray + 0x200);
      *(uint *)(ray + 0x204) = (uint)bVar3 * auVar36._4_4_ | (uint)!bVar3 * *(int *)(ray + 0x204);
      *(uint *)(ray + 0x208) = (uint)bVar4 * auVar36._8_4_ | (uint)!bVar4 * *(int *)(ray + 0x208);
      *(uint *)(ray + 0x20c) = (uint)bVar5 * auVar36._12_4_ | (uint)!bVar5 * *(int *)(ray + 0x20c);
      *(uint *)(ray + 0x210) = (uint)bVar6 * auVar36._16_4_ | (uint)!bVar6 * *(int *)(ray + 0x210);
      *(uint *)(ray + 0x214) = (uint)bVar7 * auVar36._20_4_ | (uint)!bVar7 * *(int *)(ray + 0x214);
      *(uint *)(ray + 0x218) = (uint)bVar8 * auVar36._24_4_ | (uint)!bVar8 * *(int *)(ray + 0x218);
      *(uint *)(ray + 0x21c) = (uint)bVar9 * auVar36._28_4_ | (uint)!bVar9 * *(int *)(ray + 0x21c);
      *(uint *)(ray + 0x220) = (uint)bVar11 * auVar36._32_4_ | (uint)!bVar11 * *(int *)(ray + 0x220)
      ;
      *(uint *)(ray + 0x224) = (uint)bVar12 * auVar36._36_4_ | (uint)!bVar12 * *(int *)(ray + 0x224)
      ;
      *(uint *)(ray + 0x228) = (uint)bVar13 * auVar36._40_4_ | (uint)!bVar13 * *(int *)(ray + 0x228)
      ;
      *(uint *)(ray + 0x22c) = (uint)bVar14 * auVar36._44_4_ | (uint)!bVar14 * *(int *)(ray + 0x22c)
      ;
      *(uint *)(ray + 0x230) = (uint)bVar15 * auVar36._48_4_ | (uint)!bVar15 * *(int *)(ray + 0x230)
      ;
      *(uint *)(ray + 0x234) = (uint)bVar16 * auVar36._52_4_ | (uint)!bVar16 * *(int *)(ray + 0x234)
      ;
      *(uint *)(ray + 0x238) = (uint)bVar17 * auVar36._56_4_ | (uint)!bVar17 * *(int *)(ray + 0x238)
      ;
      *(uint *)(ray + 0x23c) = (uint)bVar18 * auVar36._60_4_ | (uint)!bVar18 * *(int *)(ray + 0x23c)
      ;
    }
  }
  return;
code_r0x00887161:
  uVar23 = uVar28 & 0xfffffffffffffff0;
  lVar26 = -0x10;
  uVar28 = 8;
  auVar47 = auVar37;
  do {
    uVar29 = *(ulong *)(uVar23 + 0x20 + lVar26 * 2);
    if (uVar29 == 8) break;
    auVar48 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar23 + 0x90 + lVar26)));
    auVar2 = *(undefined1 (*) [64])(ray + 0x1c0);
    uVar1 = *(undefined4 *)(uVar23 + 0x30 + lVar26);
    auVar49._4_4_ = uVar1;
    auVar49._0_4_ = uVar1;
    auVar49._8_4_ = uVar1;
    auVar49._12_4_ = uVar1;
    auVar49._16_4_ = uVar1;
    auVar49._20_4_ = uVar1;
    auVar49._24_4_ = uVar1;
    auVar49._28_4_ = uVar1;
    auVar49._32_4_ = uVar1;
    auVar49._36_4_ = uVar1;
    auVar49._40_4_ = uVar1;
    auVar49._44_4_ = uVar1;
    auVar49._48_4_ = uVar1;
    auVar49._52_4_ = uVar1;
    auVar49._56_4_ = uVar1;
    auVar49._60_4_ = uVar1;
    auVar49 = vfmadd213ps_avx512f(auVar48,auVar2,auVar49);
    auVar50 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar23 + 0xb0 + lVar26)));
    uVar1 = *(undefined4 *)(uVar23 + 0x50 + lVar26);
    auVar48._4_4_ = uVar1;
    auVar48._0_4_ = uVar1;
    auVar48._8_4_ = uVar1;
    auVar48._12_4_ = uVar1;
    auVar48._16_4_ = uVar1;
    auVar48._20_4_ = uVar1;
    auVar48._24_4_ = uVar1;
    auVar48._28_4_ = uVar1;
    auVar48._32_4_ = uVar1;
    auVar48._36_4_ = uVar1;
    auVar48._40_4_ = uVar1;
    auVar48._44_4_ = uVar1;
    auVar48._48_4_ = uVar1;
    auVar48._52_4_ = uVar1;
    auVar48._56_4_ = uVar1;
    auVar48._60_4_ = uVar1;
    auVar48 = vfmadd213ps_avx512f(auVar50,auVar2,auVar48);
    auVar51 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar23 + 0xd0 + lVar26)));
    uVar1 = *(undefined4 *)(uVar23 + 0x70 + lVar26);
    auVar50._4_4_ = uVar1;
    auVar50._0_4_ = uVar1;
    auVar50._8_4_ = uVar1;
    auVar50._12_4_ = uVar1;
    auVar50._16_4_ = uVar1;
    auVar50._20_4_ = uVar1;
    auVar50._24_4_ = uVar1;
    auVar50._28_4_ = uVar1;
    auVar50._32_4_ = uVar1;
    auVar50._36_4_ = uVar1;
    auVar50._40_4_ = uVar1;
    auVar50._44_4_ = uVar1;
    auVar50._48_4_ = uVar1;
    auVar50._52_4_ = uVar1;
    auVar50._56_4_ = uVar1;
    auVar50._60_4_ = uVar1;
    auVar50 = vfmadd213ps_avx512f(auVar51,auVar2,auVar50);
    auVar52 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar23 + 0xa0 + lVar26)));
    uVar1 = *(undefined4 *)(uVar23 + 0x40 + lVar26);
    auVar51._4_4_ = uVar1;
    auVar51._0_4_ = uVar1;
    auVar51._8_4_ = uVar1;
    auVar51._12_4_ = uVar1;
    auVar51._16_4_ = uVar1;
    auVar51._20_4_ = uVar1;
    auVar51._24_4_ = uVar1;
    auVar51._28_4_ = uVar1;
    auVar51._32_4_ = uVar1;
    auVar51._36_4_ = uVar1;
    auVar51._40_4_ = uVar1;
    auVar51._44_4_ = uVar1;
    auVar51._48_4_ = uVar1;
    auVar51._52_4_ = uVar1;
    auVar51._56_4_ = uVar1;
    auVar51._60_4_ = uVar1;
    auVar51 = vfmadd213ps_avx512f(auVar52,auVar2,auVar51);
    auVar53 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar23 + 0xc0 + lVar26)));
    uVar1 = *(undefined4 *)(uVar23 + 0x60 + lVar26);
    auVar52._4_4_ = uVar1;
    auVar52._0_4_ = uVar1;
    auVar52._8_4_ = uVar1;
    auVar52._12_4_ = uVar1;
    auVar52._16_4_ = uVar1;
    auVar52._20_4_ = uVar1;
    auVar52._24_4_ = uVar1;
    auVar52._28_4_ = uVar1;
    auVar52._32_4_ = uVar1;
    auVar52._36_4_ = uVar1;
    auVar52._40_4_ = uVar1;
    auVar52._44_4_ = uVar1;
    auVar52._48_4_ = uVar1;
    auVar52._52_4_ = uVar1;
    auVar52._56_4_ = uVar1;
    auVar52._60_4_ = uVar1;
    auVar52 = vfmadd213ps_avx512f(auVar53,auVar2,auVar52);
    auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar23 + 0xe0 + lVar26)));
    uVar1 = *(undefined4 *)(uVar23 + 0x80 + lVar26);
    auVar53._4_4_ = uVar1;
    auVar53._0_4_ = uVar1;
    auVar53._8_4_ = uVar1;
    auVar53._12_4_ = uVar1;
    auVar53._16_4_ = uVar1;
    auVar53._20_4_ = uVar1;
    auVar53._24_4_ = uVar1;
    auVar53._28_4_ = uVar1;
    auVar53._32_4_ = uVar1;
    auVar53._36_4_ = uVar1;
    auVar53._40_4_ = uVar1;
    auVar53._44_4_ = uVar1;
    auVar53._48_4_ = uVar1;
    auVar53._52_4_ = uVar1;
    auVar53._56_4_ = uVar1;
    auVar53._60_4_ = uVar1;
    auVar53 = vfmadd213ps_avx512f(auVar54,auVar2,auVar53);
    auVar49 = vfmadd213ps_avx512f(auVar49,auVar36,auVar40);
    auVar48 = vfmadd213ps_avx512f(auVar48,auVar45,auVar41);
    auVar50 = vfmadd213ps_avx512f(auVar50,auVar46,auVar38);
    auVar51 = vfmadd213ps_avx512f(auVar51,auVar36,auVar40);
    auVar52 = vfmadd213ps_avx512f(auVar52,auVar45,auVar41);
    auVar53 = vfmadd213ps_avx512f(auVar53,auVar46,auVar38);
    auVar54 = vpminsd_avx512f(auVar49,auVar51);
    auVar55 = vpminsd_avx512f(auVar48,auVar52);
    auVar54 = vpmaxsd_avx512f(auVar54,auVar55);
    auVar55 = vpminsd_avx512f(auVar50,auVar53);
    auVar54 = vpmaxsd_avx512f(auVar54,auVar55);
    auVar49 = vpmaxsd_avx512f(auVar49,auVar51);
    auVar48 = vpmaxsd_avx512f(auVar48,auVar52);
    auVar49 = vpminsd_avx512f(auVar49,auVar48);
    auVar48 = vpmaxsd_avx512f(auVar50,auVar53);
    auVar50 = vpmaxsd_avx512f(auVar54,auVar39);
    auVar48 = vpminsd_avx512f(auVar48,auVar42);
    auVar49 = vpminsd_avx512f(auVar49,auVar48);
    uVar34 = vcmpps_avx512f(auVar50,auVar49,2);
    if ((uVar27 & 7) == 6) {
      uVar1 = *(undefined4 *)(uVar23 + 0xf0 + lVar26);
      auVar55._4_4_ = uVar1;
      auVar55._0_4_ = uVar1;
      auVar55._8_4_ = uVar1;
      auVar55._12_4_ = uVar1;
      auVar55._16_4_ = uVar1;
      auVar55._20_4_ = uVar1;
      auVar55._24_4_ = uVar1;
      auVar55._28_4_ = uVar1;
      auVar55._32_4_ = uVar1;
      auVar55._36_4_ = uVar1;
      auVar55._40_4_ = uVar1;
      auVar55._44_4_ = uVar1;
      auVar55._48_4_ = uVar1;
      auVar55._52_4_ = uVar1;
      auVar55._56_4_ = uVar1;
      auVar55._60_4_ = uVar1;
      uVar20 = vcmpps_avx512f(auVar2,auVar55,0xd);
      uVar1 = *(undefined4 *)(uVar23 + 0x100 + lVar26);
      auVar22._4_4_ = uVar1;
      auVar22._0_4_ = uVar1;
      auVar22._8_4_ = uVar1;
      auVar22._12_4_ = uVar1;
      auVar22._16_4_ = uVar1;
      auVar22._20_4_ = uVar1;
      auVar22._24_4_ = uVar1;
      auVar22._28_4_ = uVar1;
      auVar22._32_4_ = uVar1;
      auVar22._36_4_ = uVar1;
      auVar22._40_4_ = uVar1;
      auVar22._44_4_ = uVar1;
      auVar22._48_4_ = uVar1;
      auVar22._52_4_ = uVar1;
      auVar22._56_4_ = uVar1;
      auVar22._60_4_ = uVar1;
      uVar21 = vcmpps_avx512f(auVar2,auVar22,1);
      uVar34 = uVar34 & uVar20 & uVar21;
    }
    uVar20 = vcmpps_avx512f(auVar42,auVar43,6);
    uVar34 = uVar34 & uVar20;
    uVar20 = uVar28;
    auVar56 = auVar47;
    if ((short)uVar34 != 0) {
      auVar49 = vblendmps_avx512f(auVar37,auVar54);
      bVar32 = (bool)((byte)uVar34 & 1);
      auVar56._0_4_ = (uint)bVar32 * auVar49._0_4_ | (uint)!bVar32 * auVar2._0_4_;
      bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar56._4_4_ = (uint)bVar32 * auVar49._4_4_ | (uint)!bVar32 * auVar2._4_4_;
      bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar56._8_4_ = (uint)bVar32 * auVar49._8_4_ | (uint)!bVar32 * auVar2._8_4_;
      bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar56._12_4_ = (uint)bVar32 * auVar49._12_4_ | (uint)!bVar32 * auVar2._12_4_;
      bVar32 = (bool)((byte)(uVar34 >> 4) & 1);
      auVar56._16_4_ = (uint)bVar32 * auVar49._16_4_ | (uint)!bVar32 * auVar2._16_4_;
      bVar32 = (bool)((byte)(uVar34 >> 5) & 1);
      auVar56._20_4_ = (uint)bVar32 * auVar49._20_4_ | (uint)!bVar32 * auVar2._20_4_;
      bVar32 = (bool)((byte)(uVar34 >> 6) & 1);
      auVar56._24_4_ = (uint)bVar32 * auVar49._24_4_ | (uint)!bVar32 * auVar2._24_4_;
      bVar32 = (bool)((byte)(uVar34 >> 7) & 1);
      auVar56._28_4_ = (uint)bVar32 * auVar49._28_4_ | (uint)!bVar32 * auVar2._28_4_;
      bVar32 = (bool)((byte)(uVar34 >> 8) & 1);
      auVar56._32_4_ = (uint)bVar32 * auVar49._32_4_ | (uint)!bVar32 * auVar2._32_4_;
      bVar32 = (bool)((byte)(uVar34 >> 9) & 1);
      auVar56._36_4_ = (uint)bVar32 * auVar49._36_4_ | (uint)!bVar32 * auVar2._36_4_;
      bVar32 = (bool)((byte)(uVar34 >> 10) & 1);
      auVar56._40_4_ = (uint)bVar32 * auVar49._40_4_ | (uint)!bVar32 * auVar2._40_4_;
      bVar32 = (bool)((byte)(uVar34 >> 0xb) & 1);
      auVar56._44_4_ = (uint)bVar32 * auVar49._44_4_ | (uint)!bVar32 * auVar2._44_4_;
      bVar32 = (bool)((byte)(uVar34 >> 0xc) & 1);
      auVar56._48_4_ = (uint)bVar32 * auVar49._48_4_ | (uint)!bVar32 * auVar2._48_4_;
      bVar32 = (bool)((byte)(uVar34 >> 0xd) & 1);
      auVar56._52_4_ = (uint)bVar32 * auVar49._52_4_ | (uint)!bVar32 * auVar2._52_4_;
      bVar32 = (bool)((byte)(uVar34 >> 0xe) & 1);
      auVar56._56_4_ = (uint)bVar32 * auVar49._56_4_ | (uint)!bVar32 * auVar2._56_4_;
      bVar32 = SUB81(uVar34 >> 0xf,0);
      auVar56._60_4_ = (uint)bVar32 * auVar49._60_4_ | (uint)!bVar32 * auVar2._60_4_;
      uVar20 = uVar29;
      if (uVar28 != 8) {
        *puVar31 = uVar28;
        puVar31 = puVar31 + 1;
        *pauVar30 = auVar47;
        pauVar30 = pauVar30 + 1;
      }
    }
    auVar47 = auVar56;
    uVar28 = uVar20;
    lVar26 = lVar26 + 4;
  } while (lVar26 != 0);
  auVar43 = auVar47;
  if (uVar28 == 8) goto LAB_008872e1;
  goto LAB_00887157;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }